

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O1

void __thiscall SPTest_OrderConsByStage_Test::TestBody(SPTest_OrderConsByStage_Test *this)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  SuffixHandler<int> SVar4;
  char *pcVar5;
  StringRef name;
  AssertionResult gtest_ar;
  TestProblem p;
  SPAdapter sp;
  NLHeader header;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_738;
  AssertHelper local_730;
  internal local_728 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_720;
  TestProblem local_718;
  SPAdapter local_368;
  NLHeader local_120;
  
  memset(&local_120,0,0x110);
  local_120.super_NLInfo.super_NLInfo_C.format = 1;
  local_120.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  local_120.super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  local_120.super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  local_120.super_NLInfo.super_NLInfo_C.arith_kind = 1;
  local_120.super_NLInfo.super_NLInfo_C.flags = 1;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  local_120.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = 1;
  local_120.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_integer_vars = 0;
  local_120.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem(&local_718,&local_120);
  name.size_ = 5;
  name.data_ = "stage";
  SVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_718,name,0);
  **(undefined4 **)((long)SVar4.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) = 2;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_718,0.0,7.0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_718,0.0,11.0);
  local_368.problem_ = local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_;
  mp::ColProblemBuilder::ColumnSizeHandler::Add((ColumnSizeHandler *)&local_368,1);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
             ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->super_Problem).
             algebraic_cons_.
             super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  piVar2 = ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->col_starts_).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->row_indices_).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[iVar1] = 0;
  ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->coefs_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [iVar1] = 1.0;
  mp::SPAdapter::SPAdapter(&local_368,&local_718.super_ColProblem);
  local_730.data_._0_4_ = 0xb;
  local_738.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((local_368.problem_)->super_Problem).algebraic_cons_.
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
       ._M_impl.super__Vector_impl_data._M_start
       [*local_368.con_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start].ub;
  testing::internal::CmpHelperEQ<int,double>
            (local_728,"11","sp.con(0).ub()",(int *)&local_730,(double *)&local_738);
  if (local_728[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_738);
    if (local_720.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_720.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x221,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_730,(Message *)&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    if (local_738.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_738.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_738.ptr_ + 8))();
      }
      local_738.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_720,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_730.data_._0_4_ = 7;
  local_738.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((local_368.problem_)->super_Problem).algebraic_cons_.
       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
       ._M_impl.super__Vector_impl_data._M_start
       [local_368.con_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[1]].ub;
  testing::internal::CmpHelperEQ<int,double>
            (local_728,"7","sp.con(1).ub()",(int *)&local_730,(double *)&local_738);
  if (local_728[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_738);
    if (local_720.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_720.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x222,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_730,(Message *)&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    if (local_738.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_738.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_738.ptr_ + 8))();
      }
      local_738.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_720,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::SPAdapter::~SPAdapter(&local_368);
  local_718.super_ColProblem.super_Problem.super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ColProblem_00199678;
  local_718.super_ColProblem.super_Problem.super_SuffixManager._vptr_SuffixManager =
       (_func_int **)&PTR__ColProblem_00199698;
  if (local_718.super_ColProblem.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_718.super_ColProblem.coefs_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_718.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_718.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_718.super_ColProblem.row_indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_718.super_ColProblem.row_indices_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_718.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_718.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_718.super_ColProblem.col_starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_718.super_ColProblem.col_starts_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_718.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_718.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_718);
  return;
}

Assistant:

TEST(SPTest, OrderConsByStage) {
  auto header = MakeHeader(1);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  auto stage = p.AddIntSuffix("stage", mp::suf::VAR, 1);
  stage.SetValue(0, 2);
  p.AddCon(0, 7);
  p.AddCon(0, 11);
  p.OnColumnSizes().Add(1);
  auto expr = p.OnLinearConExpr(0);
  expr.AddTerm(0, 1);
  mp::SPAdapter sp(p);
  EXPECT_EQ(11, sp.con(0).ub());
  EXPECT_EQ( 7, sp.con(1).ub());
}